

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool ON_Font::IsValidFaceName(wchar_t *face_name)

{
  wchar_t wVar1;
  bool bVar2;
  int local_1c;
  int i;
  wchar_t *face_name_local;
  
  if (((face_name != (wchar_t *)0x0) && (*face_name != L'\0')) && (*face_name != L' ')) {
    local_1c = 0;
    while( true ) {
      bVar2 = false;
      if (local_1c < 0x20) {
        bVar2 = face_name[local_1c] != L'\0';
      }
      if (!bVar2) {
        if (face_name[local_1c] == L'\0') {
          return true;
        }
        return false;
      }
      if (face_name[local_1c] < L' ') {
        return false;
      }
      wVar1 = face_name[local_1c];
      if ((((uint)(wVar1 + L'\xffffffde') < 2) || (wVar1 == L'\'')) ||
         ((wVar1 == L';' || ((wVar1 == L'=' || (wVar1 == L'`')))))) break;
      local_1c = local_1c + 1;
    }
  }
  return false;
}

Assistant:

bool ON_Font::IsValidFaceName(
  const wchar_t* face_name
  )
{
  if ( nullptr == face_name || 0 == face_name[0] || ON_wString::Space == face_name[0])
    return false;
  
  int i = 0;
  while (i < 32 && 0 != face_name[i])
  {
    if (face_name[i] < ON_wString::Space )
      return false;
    switch (face_name[i])
    {
    case ';':
    case '"':
    case '\'':
    case '`':
    case '=':
    case '#':
      // lots more
      return false;
    //case '@': - There are valid fonts like @Gulim with '@' in the name.
    // case '.' - Many apple font names begin with a period
    // case '-' - A hyphen is common in PostScript names
    // case ' ' - A space is common in many names
    default:
      break;
    }
    
    i++;
  }

  if (0 != face_name[i])
    return false;

  return true;
}